

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom
          (DecorationManager *this,uint32_t id,
          function<bool_(const_spvtools::opt::Instruction_&)> *pred)

{
  Op OVar1;
  undefined8 *puVar2;
  _Hash_node_base *p_Var3;
  pointer pOVar4;
  iterator iVar5;
  iterator iVar6;
  IRContext *pIVar7;
  bool bVar8;
  uint32_t uVar9;
  _Type acVar10;
  __node_base_ptr p_Var11;
  Operand *pOVar12;
  Operand *pOVar13;
  undefined4 extraout_var;
  Instruction *node;
  ulong uVar14;
  size_type sVar15;
  uint uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  _Hash_node_base *p_Var19;
  long lVar20;
  long lVar21;
  __node_base_ptr p_Var22;
  __node_base_ptr p_Var23;
  uint uVar24;
  uint index;
  iterator __begin2;
  _Hash_node_base *p_Var25;
  Instruction **ppIVar26;
  iterator __end2;
  undefined8 *puVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  Instruction *inst_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> insts_to_kill;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  group_decorations_to_keep;
  Instruction *decoration;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  indirect_decorations_to_remove;
  Instruction *local_118;
  array<signed_char,_4UL> local_10c;
  ulong local_108;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_100;
  Instruction **local_f8;
  iterator iStack_f0;
  Instruction **local_e8;
  long local_e0;
  Instruction **local_d8;
  iterator iStack_d0;
  Instruction **local_c8;
  IRContext *local_c0;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  DecorationManager *local_90;
  undefined8 *local_88;
  int local_7c;
  long local_78;
  undefined8 *local_70;
  undefined1 local_68 [56];
  
  uVar14 = (this->id_to_decoration_insts_)._M_h._M_bucket_count;
  uVar17 = (ulong)id % uVar14;
  p_Var22 = (this->id_to_decoration_insts_)._M_h._M_buckets[uVar17];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var22 != (__node_base_ptr)0x0) &&
     (p_Var19 = p_Var22->_M_nxt, p_Var11 = p_Var22, *(uint32_t *)&p_Var22->_M_nxt[1]._M_nxt != id))
  {
    while (p_Var22 = p_Var19, p_Var19 = p_Var22->_M_nxt, p_Var19 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var19[1]._M_nxt % uVar14 != uVar17) ||
         (p_Var11 = p_Var22, *(uint *)&p_Var19[1]._M_nxt == id)) goto LAB_00595e38;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00595e38:
  if (p_Var11 == (__node_base_ptr)0x0) {
    local_100._M_cur = (__node_type *)0x0;
  }
  else {
    local_100._M_cur = (__node_type *)p_Var11->_M_nxt;
  }
  if (local_100._M_cur == (__node_type *)0x0) {
    return (bool)0;
  }
  local_c0 = this->module_->context_;
  local_f8 = (Instruction **)0x0;
  iStack_f0._M_current = (Instruction **)0x0;
  local_e8 = (Instruction **)0x0;
  local_e0 = *(long *)((long)&((local_100._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                              ._M_storage._M_storage + 0x38);
  local_78 = *(long *)((long)&((local_100._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                              ._M_storage._M_storage + 0x40);
  puVar18 = *(undefined8 **)
             ((long)&((local_100._M_cur)->
                     super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                     ._M_storage._M_storage + 8);
  puVar2 = *(undefined8 **)
            ((long)&((local_100._M_cur)->
                    super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                    ._M_storage._M_storage + 0x10);
  local_10c._M_elems = (_Type)id;
  if (puVar18 != puVar2) {
    do {
      local_68._0_8_ = *puVar18;
      if ((pred->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_005967af:
        std::__throw_bad_function_call();
      }
      bVar8 = (*pred->_M_invoker)((_Any_data *)pred,(Instruction *)local_68._0_8_);
      if (bVar8) {
        if (iStack_f0._M_current == local_e8) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_f8,iStack_f0,(Instruction **)local_68);
        }
        else {
          *iStack_f0._M_current = (Instruction *)local_68._0_8_;
          iStack_f0._M_current = iStack_f0._M_current + 1;
        }
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar2);
  }
  local_68._0_8_ = local_68 + 0x30;
  local_68._8_8_ = 1;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = 0;
  local_68._32_4_ = 1.0;
  local_68._40_8_ = 0;
  local_68._48_8_ = (__node_base_ptr)0x0;
  puVar18 = *(undefined8 **)
             ((long)&((local_100._M_cur)->
                     super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                     ._M_storage._M_storage + 0x20);
  local_70 = *(undefined8 **)
              ((long)&((local_100._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                      ._M_storage._M_storage + 0x28);
  local_90 = this;
  if (puVar18 == local_70) {
    local_108 = 0;
  }
  else {
    local_108 = 0;
    do {
      local_118 = (Instruction *)*puVar18;
      if ((local_118->opcode_ & ~OpUndef) != OpGroupDecorate) {
        __assert_fail("inst->opcode() == spv::Op::OpGroupDecorate || inst->opcode() == spv::Op::OpGroupMemberDecorate"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x4f,
                      "bool spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(uint32_t, std::function<bool (const Instruction &)>)"
                     );
      }
      local_d8 = (Instruction **)0x0;
      iStack_d0._M_current = (Instruction **)0x0;
      local_c8 = (Instruction **)0x0;
      uVar9 = (local_118->has_result_id_ & 1) + 1;
      if (local_118->has_type_id_ == false) {
        uVar9 = (uint)local_118->has_result_id_;
      }
      uVar9 = Instruction::GetSingleWordOperand(local_118,uVar9);
      uVar14 = (this->id_to_decoration_insts_)._M_h._M_bucket_count;
      uVar17 = (ulong)uVar9 % uVar14;
      p_Var22 = (this->id_to_decoration_insts_)._M_h._M_buckets[uVar17];
      p_Var11 = (__node_base_ptr)0x0;
      if ((p_Var22 != (__node_base_ptr)0x0) &&
         (p_Var11 = p_Var22, p_Var23 = p_Var22->_M_nxt,
         uVar9 != *(uint32_t *)&p_Var22->_M_nxt[1]._M_nxt)) {
        while (p_Var19 = p_Var23->_M_nxt, p_Var19 != (_Hash_node_base *)0x0) {
          p_Var11 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var19[1]._M_nxt % uVar14 != uVar17) ||
             (p_Var11 = p_Var23, p_Var23 = p_Var19, uVar9 == *(uint *)&p_Var19[1]._M_nxt))
          goto LAB_00595fe5;
        }
        p_Var11 = (__node_base_ptr)0x0;
      }
LAB_00595fe5:
      if (p_Var11 == (__node_base_ptr)0x0) {
        p_Var19 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var19 = p_Var11->_M_nxt;
      }
      local_88 = puVar18;
      if (p_Var19 == (_Hash_node_base *)0x0) {
        __assert_fail("group_iter != id_to_decoration_insts_.end() && \"Unknown decoration group\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x55,
                      "bool spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(uint32_t, std::function<bool (const Instruction &)>)"
                     );
      }
      p_Var3 = p_Var19[3]._M_nxt;
      for (p_Var25 = p_Var19[2]._M_nxt; p_Var25 != p_Var3; p_Var25 = p_Var25 + 1) {
        local_b8._0_8_ = p_Var25->_M_nxt;
        if ((pred->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005967af;
        bVar8 = (*pred->_M_invoker)((_Any_data *)pred,(Instruction *)local_b8._0_8_);
        if (!bVar8) {
          if (iStack_d0._M_current == local_c8) {
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            _M_realloc_insert<spvtools::opt::Instruction*const&>
                      ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                        *)&local_d8,iStack_d0,(Instruction **)local_b8);
          }
          else {
            *iStack_d0._M_current = (Instruction *)local_b8._0_8_;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
        }
      }
      if ((p_Var19[3]._M_nxt == p_Var19[2]._M_nxt) ||
         ((long)iStack_d0._M_current - (long)local_d8 !=
          (long)p_Var19[3]._M_nxt - (long)p_Var19[2]._M_nxt)) {
        OVar1 = local_118->opcode_;
        uVar24 = (local_118->has_result_id_ & 1) + 1;
        if (local_118->has_type_id_ == false) {
          uVar24 = (uint)local_118->has_result_id_;
        }
        uVar16 = (int)((ulong)((long)(local_118->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_118->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                 uVar24;
        if (1 < uVar16) {
          local_7c = (OVar1 != OpGroupDecorate) + 1;
          index = 1;
          do {
            acVar10 = (_Type)Instruction::GetSingleWordOperand(local_118,uVar24 + index);
            if (acVar10 == local_10c._M_elems) {
              local_108 = CONCAT44(local_108._4_4_,index + 1);
              do {
                uVar24 = (local_118->has_result_id_ & 1) + 1;
                if (local_118->has_type_id_ == false) {
                  uVar24 = (uint)local_118->has_result_id_;
                }
                uVar24 = ((int)((ulong)((long)(local_118->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_118->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555 + (OVar1 == OpGroupDecorate | 0xfffffffe)) - uVar24;
                if (index < uVar24) {
                  pOVar12 = Instruction::GetInOperand(local_118,uVar24);
                  pOVar13 = Instruction::GetInOperand(local_118,index);
                  pOVar13->type = pOVar12->type;
                  utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar13->words,&pOVar12->words);
                }
                if (OVar1 != OpGroupDecorate) {
                  if (index < uVar24) {
                    pOVar12 = Instruction::GetInOperand(local_118,uVar24 + 1);
                    pOVar13 = Instruction::GetInOperand(local_118,(uint32_t)local_108);
                    pOVar13->type = pOVar12->type;
                    utils::SmallVector<unsigned_int,_2UL>::operator=
                              (&pOVar13->words,&pOVar12->words);
                  }
                  uVar16 = (local_118->has_result_id_ & 1) + 1;
                  if (local_118->has_type_id_ == false) {
                    uVar16 = (uint)local_118->has_result_id_;
                  }
                  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                  _M_erase(&local_118->operands_,
                           (Operand *)
                           ((long)((local_118->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar24 + 1].words.
                                   buffer + -6) + (ulong)(uVar16 * 0x30)));
                }
                uVar16 = (local_118->has_result_id_ & 1) + 1;
                if (local_118->has_type_id_ == false) {
                  uVar16 = (uint)local_118->has_result_id_;
                }
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                _M_erase(&local_118->operands_,
                         (Operand *)
                         ((long)((local_118->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar24].words.buffer + -6
                                ) + (ulong)(uVar16 * 0x30)));
                uVar24 = (local_118->has_result_id_ & 1) + 1;
                if (local_118->has_type_id_ == false) {
                  uVar24 = (uint)local_118->has_result_id_;
                }
                uVar16 = (int)((ulong)((long)(local_118->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_118->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar24;
                if (uVar16 <= index) {
                  local_108 = 1;
                  goto LAB_005962a3;
                }
                acVar10 = (_Type)Instruction::GetSingleWordOperand(local_118,uVar24 + index);
              } while (acVar10 == local_10c._M_elems);
              local_108 = CONCAT71((int7)(CONCAT44(extraout_var,acVar10) >> 8),1);
            }
            index = index + local_7c;
            uVar24 = (local_118->has_result_id_ & 1) + 1;
            if (local_118->has_type_id_ == false) {
              uVar24 = (uint)local_118->has_result_id_;
            }
            uVar16 = (int)((ulong)((long)(local_118->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_118->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar24;
          } while (index < uVar16);
        }
LAB_005962a3:
        this = local_90;
        pIVar7 = local_c0;
        if (uVar16 == 1) {
          std::
          _Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<spvtools::opt::Instruction*&>
                    ((_Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_68,&local_118);
          this = local_90;
          if (iStack_f0._M_current == local_e8) {
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            _M_realloc_insert<spvtools::opt::Instruction*const&>
                      ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                        *)&local_f8,iStack_f0,&local_118);
            ppIVar26 = local_d8;
            iVar5._M_current = iStack_d0._M_current;
          }
          else {
            *iStack_f0._M_current = local_118;
            iStack_f0._M_current = iStack_f0._M_current + 1;
            ppIVar26 = local_d8;
            iVar5._M_current = iStack_d0._M_current;
          }
        }
        else {
          ppIVar26 = local_d8;
          iVar5._M_current = iStack_d0._M_current;
          if ((local_108 & 1) != 0) {
            IRContext::ForgetUses(local_c0,local_118);
            std::
            _Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<spvtools::opt::Instruction*&>
                      ((_Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_68,&local_118);
            IRContext::AnalyzeUses(pIVar7,local_118);
            ppIVar26 = local_d8;
            iVar5._M_current = iStack_d0._M_current;
          }
        }
        for (; iVar6._M_current = iStack_d0._M_current, bVar8 = ppIVar26 != iStack_d0._M_current,
            iStack_d0._M_current = iVar5._M_current, bVar8; ppIVar26 = ppIVar26 + 1) {
          node = Instruction::Clone(*ppIVar26,this->module_->context_);
          local_b8._0_8_ = &PTR__SmallVector_009488e0;
          local_b8._24_8_ = local_b8 + 0x10;
          local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_b8[0x10] = local_10c._M_elems[0];
          local_b8[0x11] = local_10c._M_elems[1];
          local_b8[0x12] = local_10c._M_elems[2];
          local_b8[0x13] = local_10c._M_elems[3];
          local_b8._8_8_ = 1;
          uVar14 = (ulong)(node->has_result_id_ & 1) + 1;
          if (node->has_type_id_ == false) {
            uVar14 = (ulong)node->has_result_id_;
          }
          pOVar4 = (node->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = ((long)(node->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                   -0x5555555555555555;
          if (uVar17 < uVar14 || uVar17 - uVar14 == 0) {
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)
                     ((long)&((OperandData *)((pOVar4->words).buffer + -4))->_vptr_SmallVector +
                     (ulong)(uint)((int)uVar14 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_b8);
          local_b8._0_8_ = &PTR__SmallVector_009488e0;
          if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_98,local_98._M_head_impl);
          }
          utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                    (&(this->module_->annotations_).super_IntrusiveList<spvtools::opt::Instruction>,
                     node);
          IRContext::AnalyzeUses
                    (local_c0,(this->module_->annotations_).
                              super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                              super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
          iVar5._M_current = iStack_d0._M_current;
          iStack_d0._M_current = iVar6._M_current;
        }
      }
      puVar18 = local_88;
      if (local_d8 != (Instruction **)0x0) {
        operator_delete(local_d8,(long)local_c8 - (long)local_d8);
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != local_70);
    local_108 = local_108 & 0xffffffffffffff01;
  }
  puVar18 = *(undefined8 **)
             ((long)&((local_100._M_cur)->
                     super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                     ._M_storage._M_storage + 0x20);
  puVar2 = *(undefined8 **)
            ((long)&((local_100._M_cur)->
                    super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                    ._M_storage._M_storage + 0x28);
  lVar20 = (long)puVar2 - (long)puVar18 >> 5;
  if (0 < lVar20) {
    lVar20 = lVar20 + 1;
    puVar18 = puVar18 + 2;
    do {
      puVar27 = puVar18;
      local_b8._0_8_ = puVar27[-2];
      sVar15 = std::
               _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_68,(key_type *)local_b8);
      if (sVar15 != 0) {
        lVar21 = local_e0;
        puVar27 = puVar27 + -2;
        goto LAB_005965ea;
      }
      local_b8._0_8_ = puVar27[-1];
      sVar15 = std::
               _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_68,(key_type *)local_b8);
      if (sVar15 != 0) {
        lVar21 = local_e0;
        puVar27 = puVar27 + -1;
        goto LAB_005965ea;
      }
      local_b8._0_8_ = *puVar27;
      sVar15 = std::
               _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_68,(key_type *)local_b8);
      lVar21 = local_e0;
      if (sVar15 != 0) goto LAB_005965ea;
      local_b8._0_8_ = puVar27[1];
      sVar15 = std::
               _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_68,(key_type *)local_b8);
      if (sVar15 != 0) {
        lVar21 = local_e0;
        puVar27 = puVar27 + 1;
        goto LAB_005965ea;
      }
      lVar20 = lVar20 + -1;
      puVar18 = puVar27 + 4;
    } while (1 < lVar20);
    puVar18 = puVar27 + 2;
  }
  lVar21 = local_e0;
  lVar20 = (long)puVar2 - (long)puVar18 >> 3;
  if (lVar20 != 1) {
    if (lVar20 != 2) {
      puVar27 = puVar2;
      if (lVar20 != 3) goto LAB_005965ea;
      local_b8._0_8_ = *puVar18;
      sVar15 = std::
               _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_68,(key_type *)local_b8);
      puVar27 = puVar18;
      if (sVar15 != 0) goto LAB_005965ea;
      puVar18 = puVar18 + 1;
    }
    local_b8._0_8_ = *puVar18;
    sVar15 = std::
             _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)local_68,(key_type *)local_b8);
    puVar27 = puVar18;
    if (sVar15 != 0) goto LAB_005965ea;
    puVar18 = puVar18 + 1;
  }
  local_b8._0_8_ = *puVar18;
  sVar15 = std::
           _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::count((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_68,(key_type *)local_b8);
  puVar27 = puVar18;
  if (sVar15 == 0) {
    puVar27 = puVar2;
  }
LAB_005965ea:
  puVar18 = puVar27 + 1;
  if (puVar18 != puVar2 && puVar27 != puVar2) {
    do {
      local_b8._0_8_ = *puVar18;
      sVar15 = std::
               _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_68,(key_type *)local_b8);
      if (sVar15 == 0) {
        *puVar27 = *puVar18;
        puVar27 = puVar27 + 1;
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar2);
  }
  pIVar7 = local_c0;
  iVar5._M_current = iStack_f0._M_current;
  puVar18 = *(undefined8 **)
             ((long)&((local_100._M_cur)->
                     super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                     ._M_storage._M_storage + 0x28);
  if ((puVar27 != puVar18) &&
     (lVar20 = *(long *)((long)&((local_100._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                                ._M_storage._M_storage + 0x28),
     lVar28 = (long)puVar27 + (lVar20 - (long)puVar18), lVar20 != lVar28)) {
    *(long *)((long)&((local_100._M_cur)->
                     super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                     ._M_storage._M_storage + 0x28) = lVar28;
  }
  bVar29 = local_f8 != iStack_f0._M_current;
  bVar8 = bVar29;
  ppIVar26 = local_f8;
  while (bVar8) {
    IRContext::KillInst(pIVar7,*ppIVar26);
    ppIVar26 = ppIVar26 + 1;
    bVar8 = ppIVar26 != iVar5._M_current;
  }
  if (iStack_f0._M_current != local_f8) {
    iStack_f0._M_current = local_f8;
  }
  if (((lVar21 != local_78) &&
      (*(long *)((long)&((local_100._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                        ._M_storage._M_storage + 8) ==
       *(long *)((long)&((local_100._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                        ._M_storage._M_storage + 0x10))) &&
     (*(long *)((long)&((local_100._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x20) ==
      *(long *)((long)&((local_100._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x28))) {
    puVar18 = *(undefined8 **)
               ((long)&((local_100._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x38);
    puVar2 = *(undefined8 **)
              ((long)&((local_100._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                      ._M_storage._M_storage + 0x40);
    if (puVar18 != puVar2) {
      do {
        local_b8._0_8_ = *puVar18;
        if (iStack_f0._M_current == local_e8) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_f8,iStack_f0,(Instruction **)local_b8);
        }
        else {
          *iStack_f0._M_current = (Instruction *)local_b8._0_8_;
          iStack_f0._M_current = iStack_f0._M_current + 1;
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar2);
    }
  }
  pIVar7 = local_c0;
  iVar5._M_current = iStack_f0._M_current;
  bVar30 = local_f8 != iStack_f0._M_current;
  bVar8 = bVar30;
  uVar14 = local_108;
  ppIVar26 = local_f8;
  while (local_108 = uVar14, bVar8) {
    IRContext::KillInst(pIVar7,*ppIVar26);
    ppIVar26 = ppIVar26 + 1;
    bVar8 = ppIVar26 != iVar5._M_current;
    uVar14 = local_108;
  }
  if (((*(long *)((long)local_100._M_cur + 0x10) == *(long *)((long)local_100._M_cur + 0x18)) &&
      (*(long *)((long)local_100._M_cur + 0x28) == *(long *)((long)local_100._M_cur + 0x30))) &&
     (*(long *)((long)local_100._M_cur + 0x40) == *(long *)((long)local_100._M_cur + 0x48))) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)local_90,(const_iterator)local_100._M_cur);
  }
  std::
  _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  if (local_f8 != (Instruction **)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  return (bool)((byte)uVar14 | bVar29 | bVar30);
}

Assistant:

bool DecorationManager::RemoveDecorationsFrom(
    uint32_t id, std::function<bool(const Instruction&)> pred) {
  bool was_modified = false;
  const auto ids_iter = id_to_decoration_insts_.find(id);
  if (ids_iter == id_to_decoration_insts_.end()) {
    return was_modified;
  }

  TargetData& decorations_info = ids_iter->second;
  auto context = module_->context();
  std::vector<Instruction*> insts_to_kill;
  const bool is_group = !decorations_info.decorate_insts.empty();

  // Schedule all direct decorations for removal if instructed as such by
  // |pred|.
  for (Instruction* inst : decorations_info.direct_decorations)
    if (pred(*inst)) insts_to_kill.push_back(inst);

  // For all groups being directly applied to |id|, remove |id| (and the
  // literal if |inst| is an OpGroupMemberDecorate) from the instruction
  // applying the group.
  std::unordered_set<const Instruction*> indirect_decorations_to_remove;
  for (Instruction* inst : decorations_info.indirect_decorations) {
    assert(inst->opcode() == spv::Op::OpGroupDecorate ||
           inst->opcode() == spv::Op::OpGroupMemberDecorate);

    std::vector<Instruction*> group_decorations_to_keep;
    const uint32_t group_id = inst->GetSingleWordInOperand(0u);
    const auto group_iter = id_to_decoration_insts_.find(group_id);
    assert(group_iter != id_to_decoration_insts_.end() &&
           "Unknown decoration group");
    const auto& group_decorations = group_iter->second.direct_decorations;
    for (Instruction* decoration : group_decorations) {
      if (!pred(*decoration)) group_decorations_to_keep.push_back(decoration);
    }

    // If all decorations should be kept, then we can keep |id| part of the
    // group.  However, if the group itself has no decorations, we should remove
    // the id from the group.  This is needed to make |KillNameAndDecorate| work
    // correctly when a decoration group has no decorations.
    if (group_decorations_to_keep.size() == group_decorations.size() &&
        group_decorations.size() != 0) {
      continue;
    }

    // Otherwise, remove |id| from the targets of |group_id|
    const uint32_t stride =
        inst->opcode() == spv::Op::OpGroupDecorate ? 1u : 2u;
    for (uint32_t i = 1u; i < inst->NumInOperands();) {
      if (inst->GetSingleWordInOperand(i) != id) {
        i += stride;
        continue;
      }

      const uint32_t last_operand_index = inst->NumInOperands() - stride;
      if (i < last_operand_index)
        inst->GetInOperand(i) = inst->GetInOperand(last_operand_index);
      // Remove the associated literal, if it exists.
      if (stride == 2u) {
        if (i < last_operand_index)
          inst->GetInOperand(i + 1u) =
              inst->GetInOperand(last_operand_index + 1u);
        inst->RemoveInOperand(last_operand_index + 1u);
      }
      inst->RemoveInOperand(last_operand_index);
      was_modified = true;
    }

    // If the instruction has no targets left, remove the instruction
    // altogether.
    if (inst->NumInOperands() == 1u) {
      indirect_decorations_to_remove.emplace(inst);
      insts_to_kill.push_back(inst);
    } else if (was_modified) {
      context->ForgetUses(inst);
      indirect_decorations_to_remove.emplace(inst);
      context->AnalyzeUses(inst);
    }

    // If only some of the decorations should be kept, clone them and apply
    // them directly to |id|.
    if (!group_decorations_to_keep.empty()) {
      for (Instruction* decoration : group_decorations_to_keep) {
        // simply clone decoration and change |group_id| to |id|
        std::unique_ptr<Instruction> new_inst(
            decoration->Clone(module_->context()));
        new_inst->SetInOperand(0, {id});
        module_->AddAnnotationInst(std::move(new_inst));
        auto decoration_iter = --module_->annotation_end();
        context->AnalyzeUses(&*decoration_iter);
      }
    }
  }

  auto& indirect_decorations = decorations_info.indirect_decorations;
  indirect_decorations.erase(
      std::remove_if(
          indirect_decorations.begin(), indirect_decorations.end(),
          [&indirect_decorations_to_remove](const Instruction* inst) {
            return indirect_decorations_to_remove.count(inst);
          }),
      indirect_decorations.end());

  was_modified |= !insts_to_kill.empty();
  for (Instruction* inst : insts_to_kill) context->KillInst(inst);
  insts_to_kill.clear();

  // Schedule all instructions applying the group for removal if this group no
  // longer applies decorations, either directly or indirectly.
  if (is_group && decorations_info.direct_decorations.empty() &&
      decorations_info.indirect_decorations.empty()) {
    for (Instruction* inst : decorations_info.decorate_insts)
      insts_to_kill.push_back(inst);
  }
  was_modified |= !insts_to_kill.empty();
  for (Instruction* inst : insts_to_kill) context->KillInst(inst);

  if (decorations_info.direct_decorations.empty() &&
      decorations_info.indirect_decorations.empty() &&
      decorations_info.decorate_insts.empty()) {
    id_to_decoration_insts_.erase(ids_iter);
  }
  return was_modified;
}